

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall ChainstateManager::CheckBlockIndex(ChainstateManager *this)

{
  long *plVar1;
  uint64_t uVar2;
  pointer ppCVar3;
  key_type pCVar4;
  undefined8 uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  _Self __tmp_1;
  Chainstate *pCVar9;
  CBlockIndex *pCVar10;
  CBlockIndex *pCVar11;
  size_type sVar12;
  Chainstate *pCVar13;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> _Var14;
  _Rb_tree_node_base *p_Var15;
  uint uVar16;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> _Var17;
  __node_base *p_Var18;
  long lVar19;
  int iVar20;
  _Self __tmp;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  pVar21;
  anon_class_96_12_0591e926 snap_update_firsts;
  CBlockIndex *snap_first_nosv;
  CBlockIndex *snap_first_nocv;
  CBlockIndex *snap_first_notv;
  CBlockIndex *snap_first_notx;
  CBlockIndex *snap_first_missing;
  CBlockIndex *snap_base;
  CBlockIndex *pindexFirstNotScriptsValid;
  CBlockIndex *pindexFirstNotChainValid;
  CBlockIndex *pindexFirstNotTransactionsValid;
  CBlockIndex *pindexFirstNeverProcessed;
  CBlockIndex *pindexFirstMissing;
  CBlockIndex *pindex;
  CChain best_hdr_chain;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  CBlockIndex *pindexPar;
  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  forward;
  CBlockIndex *local_1a8;
  ulong local_198;
  CBlockIndexWorkComparator local_179;
  anon_class_96_12_0591e926 local_178;
  CBlockIndex *local_118;
  CBlockIndex *local_110;
  CBlockIndex *local_108;
  CBlockIndex *local_100;
  CBlockIndex *local_f8;
  CBlockIndex *local_f0;
  CBlockIndex *local_e8;
  CBlockIndex *local_e0;
  CBlockIndex *local_d8;
  CBlockIndex *local_d0;
  CBlockIndex *local_c8;
  key_type local_c0;
  _Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> local_b8;
  unique_lock<std::recursive_mutex> local_98;
  undefined1 local_88 [32];
  _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = ShouldCheckBlockIndex(this);
  if (bVar7) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_98,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0x1459,false);
    pCVar9 = ActiveChainstate(this);
    if ((int)((ulong)((long)(pCVar9->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar9->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3) < 1) {
      if (1 < (this->m_blockman).m_block_index._M_h._M_element_count) {
        __assert_fail("m_blockman.m_block_index.size() <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x145f,"void ChainstateManager::CheckBlockIndex()");
      }
    }
    else {
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (this->m_best_header == (CBlockIndex *)0x0) {
        __assert_fail("m_best_header",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1469,"void ChainstateManager::CheckBlockIndex()");
      }
      CChain::SetTip((CChain *)&local_b8,this->m_best_header);
      local_68._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_68._M_impl.super__Rb_tree_header._M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var18 = &(this->m_blockman).m_block_index._M_h._M_before_begin;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
        bVar7 = CChain::Contains((CChain *)&local_b8,(CBlockIndex *)(p_Var18 + 5));
        if (!bVar7) {
          if (p_Var18[6]._M_nxt == (_Hash_node_base *)0x0) {
            __assert_fail("block_index.pprev",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1471,"void ChainstateManager::CheckBlockIndex()");
          }
          local_178.pindex = (CBlockIndex **)(p_Var18 + 5);
          std::
          _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
          ::_M_emplace_equal<CBlockIndex*&,CBlockIndex*>
                    ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                      *)&local_68,(CBlockIndex **)(p_Var18 + 6),(CBlockIndex **)&local_178);
        }
      }
      if (local_68._M_impl.super__Rb_tree_header._M_node_count +
          (((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
           (long)local_b8._M_impl.super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000 >>
          0x20) + 1 != (this->m_blockman).m_block_index._M_h._M_element_count) {
        __assert_fail("forward.size() + best_hdr_chain.Height() + 1 == m_blockman.m_block_index.size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1475,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((int)((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
        local_c0 = (CBlockIndex *)0x0;
LAB_008b5d34:
        __assert_fail("pindex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1478,"void ChainstateManager::CheckBlockIndex()");
      }
      local_c0 = (key_type)*(uint256 **)local_b8._M_impl.super__Vector_impl_data._M_start;
      if (local_c0 == (CBlockIndex *)0x0) goto LAB_008b5d34;
      local_c8 = (CBlockIndex *)0x0;
      local_d0 = (CBlockIndex *)0x0;
      local_d8 = (CBlockIndex *)0x0;
      local_e0 = (CBlockIndex *)0x0;
      local_e8 = (CBlockIndex *)0x0;
      local_f0 = GetSnapshotBaseBlock(this);
      local_178.snap_base = &local_f0;
      local_178.snap_first_missing = &local_f8;
      local_f8 = (CBlockIndex *)0x0;
      local_178.snap_first_notx = &local_100;
      local_100 = (CBlockIndex *)0x0;
      local_178.snap_first_notv = &local_108;
      local_108 = (CBlockIndex *)0x0;
      local_178.snap_first_nocv = &local_110;
      local_110 = (CBlockIndex *)0x0;
      local_178.snap_first_nosv = &local_118;
      local_118 = (CBlockIndex *)0x0;
      local_178.pindex = &local_c0;
      local_178.pindexFirstMissing = &local_c8;
      local_178.pindexFirstNeverProcessed = &local_d0;
      local_178.pindexFirstNotTransactionsValid = &local_d8;
      local_178.pindexFirstNotChainValid = &local_e0;
      local_178.pindexFirstNotScriptsValid = &local_e8;
      local_1a8 = (CBlockIndex *)0x0;
      local_198 = 0;
      lVar19 = 0;
      pCVar10 = local_c0;
LAB_008b4f81:
      if (pCVar10 == (CBlockIndex *)0x0) goto LAB_008b58a0;
      if ((local_1a8 == (CBlockIndex *)0x0) &&
         (local_1a8 = (CBlockIndex *)0x0, (pCVar10->nStatus & 0x20) != 0)) {
        local_1a8 = pCVar10;
      }
      if ((local_c8 == (CBlockIndex *)0x0) && ((pCVar10->nStatus & 8) == 0)) {
        local_c8 = pCVar10;
      }
      if ((local_d0 == (CBlockIndex *)0x0) && (pCVar10->nTx == 0)) {
        local_d0 = pCVar10;
      }
      if (pCVar10->pprev == (CBlockIndex *)0x0) {
        CBlockIndex::GetBlockHash((uint256 *)local_88,pCVar10);
        bVar7 = ::operator==((base_blob<256U> *)local_88,
                             (base_blob<256U> *)(this->m_options).chainparams);
        if (!bVar7) {
          __assert_fail("pindex->GetBlockHash() == GetConsensus().hashGenesisBlock",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14b3,"void ChainstateManager::CheckBlockIndex()");
        }
        GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_88,this);
        for (pCVar10 = (CBlockIndex *)local_88._0_8_; pCVar10 != (CBlockIndex *)local_88._8_8_;
            pCVar10 = (CBlockIndex *)&pCVar10->pprev) {
          plVar1 = *(long **)(pCVar10->phashBlock[2].super_base_blob<256U>.m_data._M_elems + 0x18);
          if (((*(long **)pCVar10->phashBlock[3].super_base_blob<256U>.m_data._M_elems != plVar1) &&
              (pCVar11 = (CBlockIndex *)*plVar1, pCVar11 != (CBlockIndex *)0x0)) &&
             (local_c0 != pCVar11)) {
            __assert_fail("pindex == c->m_chain.Genesis()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14b6,"void ChainstateManager::CheckBlockIndex()");
          }
        }
        std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                  ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_88);
        bVar7 = true;
        pCVar10 = local_c0;
      }
      else {
        uVar16 = pCVar10->nStatus;
        bVar7 = (uVar16 & 6) != 0;
        if ((local_d8 == (CBlockIndex *)0x0) && ((uVar16 & 7) < 3)) {
          local_d8 = pCVar10;
        }
        if ((local_e0 == (CBlockIndex *)0x0) && ((uVar16 & 4) == 0)) {
          local_e0 = pCVar10;
        }
        if ((local_e8 == (CBlockIndex *)0x0) && ((uVar16 & 7) < 5)) {
          local_e8 = pCVar10;
        }
      }
      if ((pCVar10->m_chain_tx_count == 0) && (0 < pCVar10->nSequenceId)) {
        __assert_fail("pindex->nSequenceId <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14ba,"void ChainstateManager::CheckBlockIndex()");
      }
      uVar16 = pCVar10->nStatus;
      if ((this->m_blockman).m_have_pruned == false) {
        if ((pCVar10->nTx == 0) != ((uVar16 & 8) == 0)) {
          __assert_fail("!(pindex->nStatus & BLOCK_HAVE_DATA) == (pindex->nTx == 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14bf,"void ChainstateManager::CheckBlockIndex()");
        }
        if (local_c8 != local_d0) {
          __assert_fail("pindexFirstMissing == pindexFirstNeverProcessed",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14c0,"void ChainstateManager::CheckBlockIndex()");
        }
      }
      else if (((uVar16 & 8) != 0) && (pCVar10->nTx == 0)) {
        __assert_fail("pindex->nTx > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14c3,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((uVar16 & 0x18) == 0x10) {
        __assert_fail("pindex->nStatus & BLOCK_HAVE_DATA",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14c5,"void ChainstateManager::CheckBlockIndex()");
      }
      if (local_f0 != (CBlockIndex *)0x0) {
        pCVar11 = CBlockIndex::GetAncestor(local_f0,pCVar10->nHeight);
        uVar16 = local_c0->nStatus;
        pCVar10 = local_c0;
        if ((pCVar11 == local_c0) && ((uVar16 & 6) == 0)) {
          __assert_fail("(pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14c8,"void ChainstateManager::CheckBlockIndex()");
        }
      }
      if ((pCVar10->nTx == 0) == 2 < (uVar16 & 7)) {
        __assert_fail("((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TRANSACTIONS) == (pindex->nTx > 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14cc,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((pCVar10 != local_f0 && local_d0 != (CBlockIndex *)0x0) ==
          (pCVar10->m_chain_tx_count != 0)) {
        __assert_fail("(pindexFirstNeverProcessed == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14cf,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((local_d8 != (CBlockIndex *)0x0 && pCVar10 != local_f0) ==
          (pCVar10->m_chain_tx_count != 0)) {
        __assert_fail("(pindexFirstNotTransactionsValid == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d0,"void ChainstateManager::CheckBlockIndex()");
      }
      iVar20 = (int)local_198;
      if (pCVar10->nHeight != iVar20) {
        __assert_fail("pindex->nHeight == nHeight",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d1,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((pCVar10->pprev != (CBlockIndex *)0x0) &&
         (bVar8 = operator>=(&(pCVar10->nChainWork).super_base_uint<256U>,
                             &(pCVar10->pprev->nChainWork).super_base_uint<256U>), !bVar8)) {
        __assert_fail("pindex->pprev == nullptr || pindex->nChainWork >= pindex->pprev->nChainWork",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d2,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((1 < iVar20) &&
         ((local_c0->pskip == (CBlockIndex *)0x0 || (iVar20 <= local_c0->pskip->nHeight)))) {
        __assert_fail("nHeight < 2 || (pindex->pskip && (pindex->pskip->nHeight < nHeight))",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d3,"void ChainstateManager::CheckBlockIndex()");
      }
      if (!bVar7) {
        __assert_fail("pindexFirstNotTreeValid == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d4,"void ChainstateManager::CheckBlockIndex()");
      }
      uVar16 = local_c0->nStatus & 7;
      if ((3 < uVar16) && (local_e0 != (CBlockIndex *)0x0)) {
        __assert_fail("pindexFirstNotChainValid == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d6,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((4 < uVar16) && (local_e8 != (CBlockIndex *)0x0)) {
        __assert_fail("pindexFirstNotScriptsValid == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14d7,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((local_1a8 == (CBlockIndex *)0x0) && ((local_c0->nStatus & 0x60) != 0)) {
        __assert_fail("(pindex->nStatus & BLOCK_FAILED_MASK) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x14da,"void ChainstateManager::CheckBlockIndex()");
      }
      if (local_c0->pprev == (CBlockIndex *)0x0) {
        if (local_c0->m_chain_tx_count != (ulong)local_c0->nTx) {
          __assert_fail("pindex->m_chain_tx_count == pindex->nTx",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14df,"void ChainstateManager::CheckBlockIndex()");
        }
      }
      else {
        uVar2 = local_c0->pprev->m_chain_tx_count;
        if ((uVar2 == 0) || ((ulong)local_c0->nTx == 0)) {
          if ((local_c0 != local_f0) == (local_c0->m_chain_tx_count != 0)) {
            __assert_fail("(pindex->m_chain_tx_count != 0) == (pindex == snap_base)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x14e6,"void ChainstateManager::CheckBlockIndex()");
          }
        }
        else if (local_c0->m_chain_tx_count != uVar2 + local_c0->nTx) {
          __assert_fail("pindex->m_chain_tx_count == pindex->nTx + pindex->pprev->m_chain_tx_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x14e2,"void ChainstateManager::CheckBlockIndex()");
        }
      }
      GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_88,this);
      uVar5 = local_88._8_8_;
      lVar19 = lVar19 + 1;
      for (pCVar10 = (CBlockIndex *)local_88._0_8_; pCVar10 != (CBlockIndex *)uVar5;
          pCVar10 = (CBlockIndex *)&pCVar10->pprev) {
        pCVar9 = (Chainstate *)pCVar10->phashBlock;
        ppCVar3 = (pCVar9->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ppCVar3 !=
             (pCVar9->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start) &&
           (pCVar11 = ppCVar3[-1], pCVar11 != (CBlockIndex *)0x0)) {
          bVar7 = ::node::CBlockIndexWorkComparator::operator()(&local_179,local_c0,pCVar11);
          pCVar4 = local_c0;
          if ((bVar7) || ((local_d0 != (CBlockIndex *)0x0 && (local_c0 != local_f0)))) {
            sVar12 = std::
                     set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                     ::count(&pCVar9->setBlockIndexCandidates,&local_c0);
            if (sVar12 != 0) {
              __assert_fail("c->setBlockIndexCandidates.count(pindex) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x151f,"void ChainstateManager::CheckBlockIndex()");
            }
          }
          else if (local_1a8 == (CBlockIndex *)0x0) {
            if (local_c8 != (CBlockIndex *)0x0) {
              ppCVar3 = (pCVar9->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (ppCVar3 ==
                  (pCVar9->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pCVar11 = (CBlockIndex *)0x0;
              }
              else {
                pCVar11 = ppCVar3[-1];
              }
              if ((local_c0 != pCVar11) &&
                 (pCVar11 = Chainstate::SnapshotBase(pCVar9), pCVar4 != pCVar11)) goto LAB_008b535b;
            }
            pCVar13 = ActiveChainstate(this);
            if (((pCVar9 == pCVar13) ||
                (pCVar11 = CBlockIndex::GetAncestor(local_f0,local_c0->nHeight), pCVar11 == local_c0
                )) && (sVar12 = std::
                                set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                                ::count(&pCVar9->setBlockIndexCandidates,&local_c0), sVar12 == 0)) {
              __assert_fail("c->setBlockIndexCandidates.count(pindex)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x1517,"void ChainstateManager::CheckBlockIndex()");
            }
          }
        }
LAB_008b535b:
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_88);
      pVar21 = std::
               _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
               ::equal_range(&(this->m_blockman).m_blocks_unlinked._M_t,&local_c0->pprev);
      pCVar4 = local_c0;
      _Var17 = pVar21.second._M_node;
      pCVar10 = local_c0->pprev;
      for (_Var14 = pVar21.first._M_node; _Var14._M_node != _Var17._M_node;
          _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node)) {
        if (*(CBlockIndex **)(_Var14._M_node + 1) != pCVar10) {
          __assert_fail("rangeUnlinked.first->first == pindex->pprev",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1526,"void ChainstateManager::CheckBlockIndex()");
        }
        if ((CBlockIndex *)_Var14._M_node[1]._M_parent == pCVar4) break;
      }
      uVar16 = pCVar4->nStatus;
      if ((((pCVar10 != (CBlockIndex *)0x0) && (_Var14._M_node == _Var17._M_node)) &&
          (local_1a8 == (CBlockIndex *)0x0)) &&
         (((uVar16 & 8) != 0 && (local_d0 != (CBlockIndex *)0x0)))) {
        __assert_fail("foundInUnlinked",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x152f,"void ChainstateManager::CheckBlockIndex()");
      }
      uVar16 = uVar16 & 8;
      if ((_Var14._M_node != _Var17._M_node) && (uVar16 == 0)) {
        __assert_fail("!foundInUnlinked",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1531,"void ChainstateManager::CheckBlockIndex()");
      }
      if (local_c8 == (CBlockIndex *)0x0 && _Var14._M_node != _Var17._M_node) {
        __assert_fail("!foundInUnlinked",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1532,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((((pCVar10 != (CBlockIndex *)0x0) && (local_c8 != (CBlockIndex *)0x0)) && (uVar16 != 0))
         && (local_d0 == (CBlockIndex *)0x0)) {
        if ((this->m_blockman).m_have_pruned == false) {
          __assert_fail("m_blockman.m_have_pruned",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1535,"void ChainstateManager::CheckBlockIndex()");
        }
        GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_88,this);
        uVar5 = local_88._8_8_;
        for (pCVar10 = (CBlockIndex *)local_88._0_8_; pCVar10 != (CBlockIndex *)uVar5;
            pCVar10 = (CBlockIndex *)&pCVar10->pprev) {
          pCVar9 = (Chainstate *)pCVar10->phashBlock;
          pCVar13 = ActiveChainstate(this);
          ppCVar3 = (pCVar9->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar3 ==
              (pCVar9->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pCVar11 = (CBlockIndex *)0x0;
          }
          else {
            pCVar11 = ppCVar3[-1];
          }
          bVar7 = ::node::CBlockIndexWorkComparator::operator()(&local_179,local_c0,pCVar11);
          if (((!bVar7) &&
              (sVar12 = std::
                        set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                        ::count(&pCVar9->setBlockIndexCandidates,&local_c0),
              local_1a8 == (CBlockIndex *)0x0)) && (sVar12 == 0)) {
            if (pCVar9 == pCVar13) {
              if (_Var14._M_node == _Var17._M_node) goto LAB_008b59a8;
            }
            else {
              pCVar11 = CBlockIndex::GetAncestor(local_f0,local_c0->nHeight);
              if ((_Var14._M_node == _Var17._M_node) && (pCVar11 == local_c0)) {
LAB_008b59a8:
                __assert_fail("foundInUnlinked",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x1543,"void ChainstateManager::CheckBlockIndex()");
              }
            }
          }
        }
        std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                  ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_88);
      }
      CheckBlockIndex::anon_class_96_12_0591e926::operator()(&local_178);
      pVar21 = std::
               _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
               ::equal_range(&local_68,&local_c0);
      if (pVar21.first._M_node._M_node != pVar21.second._M_node._M_node) {
        pCVar10 = (CBlockIndex *)pVar21.first._M_node._M_node[1]._M_parent;
        local_198 = (ulong)(iVar20 + 1);
        local_c0 = pCVar10;
        goto LAB_008b4f81;
      }
      bVar7 = CChain::Contains((CChain *)&local_b8,local_c0);
      uVar6 = local_198;
      if (!bVar7) {
        do {
          local_198 = uVar6;
          if (local_c0 == (CBlockIndex *)0x0) {
            pCVar10 = (CBlockIndex *)0x0;
            goto LAB_008b4f81;
          }
          CheckBlockIndex::anon_class_96_12_0591e926::operator()(&local_178);
          if (local_c0 == local_1a8) {
            local_1a8 = (CBlockIndex *)0x0;
          }
          if (local_c0 == local_c8) {
            local_c8 = (CBlockIndex *)0x0;
          }
          if (local_c0 == local_d0) {
            local_d0 = (CBlockIndex *)0x0;
          }
          if (local_c0 == local_d8) {
            local_d8 = (CBlockIndex *)0x0;
          }
          if (local_c0 == local_e0) {
            local_e0 = (CBlockIndex *)0x0;
          }
          if (local_c0 == local_e8) {
            local_e8 = (CBlockIndex *)0x0;
          }
          local_88._0_8_ = local_c0->pprev;
          pVar21 = std::
                   _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                   ::equal_range(&local_68,(key_type *)local_88);
          pCVar4 = local_c0;
          for (_Var14 = pVar21.first._M_node; (CBlockIndex *)_Var14._M_node[1]._M_parent != pCVar4;
              _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node)) {
            if (_Var14._M_node == pVar21.second._M_node._M_node) {
              __assert_fail("rangePar.first != rangePar.second",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x156e,"void ChainstateManager::CheckBlockIndex()");
            }
          }
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(_Var14._M_node);
          if (p_Var15 != pVar21.second._M_node._M_node) {
            pCVar10 = (CBlockIndex *)p_Var15[1]._M_parent;
            local_c0 = pCVar10;
            goto LAB_008b4f81;
          }
          iVar20 = (int)local_198;
          if ((iVar20 < 1) ||
             ((int)((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 3) < iVar20))
          {
            pCVar10 = (CBlockIndex *)0x0;
          }
          else {
            pCVar10 = *(CBlockIndex **)
                       ((((arith_uint256 *)
                         ((long)local_b8._M_impl.super__Vector_impl_data._M_start + 0x28))->
                        super_base_uint<256U>).pn + (ulong)(iVar20 - 1) * 2 + -10);
          }
          local_c0 = (key_type)local_88._0_8_;
          uVar6 = (ulong)(iVar20 - 1);
        } while ((CBlockIndex *)local_88._0_8_ != pCVar10);
        if (iVar20 < 0) {
          pCVar10 = (CBlockIndex *)0x0;
        }
        else if (iVar20 < (int)((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 3
                               )) {
          pCVar10 = *(CBlockIndex **)
                     ((((arith_uint256 *)
                       ((long)local_b8._M_impl.super__Vector_impl_data._M_start + 0x28))->
                      super_base_uint<256U>).pn + local_198 * 2 + -10);
        }
        else {
          pCVar10 = (CBlockIndex *)0x0;
        }
        if (local_b8._M_impl.super__Vector_impl_data._M_finish ==
            local_b8._M_impl.super__Vector_impl_data._M_start) {
          pCVar11 = (CBlockIndex *)0x0;
        }
        else {
          pCVar11 = *(CBlockIndex **)
                     &((CBlockIndex *)
                      ((long)local_b8._M_impl.super__Vector_impl_data._M_finish + -0x98))->nTimeMax;
        }
        local_c0 = pCVar10;
        if (((CBlockIndex *)local_88._0_8_ != pCVar11) == (pCVar10 == (CBlockIndex *)0x0)) {
          __assert_fail("(pindex == nullptr) == (pindexPar == best_hdr_chain.Tip())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x157b,"void ChainstateManager::CheckBlockIndex()");
        }
        goto LAB_008b4f81;
      }
      if (iVar20 < -1) {
LAB_008b5892:
        local_c0 = (CBlockIndex *)0x0;
        goto LAB_008b58a0;
      }
      uVar16 = iVar20 + 1;
      local_198 = (ulong)uVar16;
      if ((int)((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar16
         ) goto LAB_008b5892;
      pCVar10 = *(CBlockIndex **)
                 ((((arith_uint256 *)
                   ((long)local_b8._M_impl.super__Vector_impl_data._M_start + 0x28))->
                  super_base_uint<256U>).pn + (ulong)uVar16 * 2 + -10);
      local_c0 = pCVar10;
      if (pCVar10 != (CBlockIndex *)0x0) goto LAB_008b4f81;
LAB_008b58a0:
      if (lVar19 != local_68._M_impl.super__Rb_tree_header._M_node_count +
                    (((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8._M_impl.super__Vector_impl_data._M_start) * 0x20000000 +
                     -0x100000000 >> 0x20) + 1) {
        __assert_fail("nNodes == forward.size() + best_hdr_chain.Height() + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1587,"void ChainstateManager::CheckBlockIndex()");
      }
      std::
      _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
      ::~_Rb_tree(&local_68);
      std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base(&local_b8);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::CheckBlockIndex()
{
    if (!ShouldCheckBlockIndex()) {
        return;
    }

    LOCK(cs_main);

    // During a reindex, we read the genesis block and call CheckBlockIndex before ActivateBestChain,
    // so we have the genesis block in m_blockman.m_block_index but no active chain. (A few of the
    // tests when iterating the block tree require that m_chain has been initialized.)
    if (ActiveChain().Height() < 0) {
        assert(m_blockman.m_block_index.size() <= 1);
        return;
    }

    // Build forward-pointing data structure for the entire block tree.
    // For performance reasons, indexes of the best header chain are stored in a vector (within CChain).
    // All remaining blocks are stored in a multimap.
    // The best header chain can differ from the active chain: E.g. its entries may belong to blocks that
    // are not yet validated.
    CChain best_hdr_chain;
    assert(m_best_header);
    best_hdr_chain.SetTip(*m_best_header);

    std::multimap<CBlockIndex*,CBlockIndex*> forward;
    for (auto& [_, block_index] : m_blockman.m_block_index) {
        // Only save indexes in forward that are not part of the best header chain.
        if (!best_hdr_chain.Contains(&block_index)) {
            // Only genesis, which must be part of the best header chain, can have a nullptr parent.
            assert(block_index.pprev);
            forward.emplace(block_index.pprev, &block_index);
        }
    }
    assert(forward.size() + best_hdr_chain.Height() + 1 == m_blockman.m_block_index.size());

    CBlockIndex* pindex = best_hdr_chain[0];
    assert(pindex);
    // Iterate over the entire block tree, using depth-first search.
    // Along the way, remember whether there are blocks on the path from genesis
    // block being explored which are the first to have certain properties.
    size_t nNodes = 0;
    int nHeight = 0;
    CBlockIndex* pindexFirstInvalid = nullptr; // Oldest ancestor of pindex which is invalid.
    CBlockIndex* pindexFirstMissing = nullptr; // Oldest ancestor of pindex which does not have BLOCK_HAVE_DATA, since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNeverProcessed = nullptr; // Oldest ancestor of pindex for which nTx == 0, since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotTreeValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_TREE (regardless of being valid or not).
    CBlockIndex* pindexFirstNotTransactionsValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_TRANSACTIONS (regardless of being valid or not), since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotChainValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_CHAIN (regardless of being valid or not), since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotScriptsValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_SCRIPTS (regardless of being valid or not), since assumeutxo snapshot if used.

    // After checking an assumeutxo snapshot block, reset pindexFirst pointers
    // to earlier blocks that have not been downloaded or validated yet, so
    // checks for later blocks can assume the earlier blocks were validated and
    // be stricter, testing for more requirements.
    const CBlockIndex* snap_base{GetSnapshotBaseBlock()};
    CBlockIndex *snap_first_missing{}, *snap_first_notx{}, *snap_first_notv{}, *snap_first_nocv{}, *snap_first_nosv{};
    auto snap_update_firsts = [&] {
        if (pindex == snap_base) {
            std::swap(snap_first_missing, pindexFirstMissing);
            std::swap(snap_first_notx, pindexFirstNeverProcessed);
            std::swap(snap_first_notv, pindexFirstNotTransactionsValid);
            std::swap(snap_first_nocv, pindexFirstNotChainValid);
            std::swap(snap_first_nosv, pindexFirstNotScriptsValid);
        }
    };

    while (pindex != nullptr) {
        nNodes++;
        if (pindexFirstInvalid == nullptr && pindex->nStatus & BLOCK_FAILED_VALID) pindexFirstInvalid = pindex;
        if (pindexFirstMissing == nullptr && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            pindexFirstMissing = pindex;
        }
        if (pindexFirstNeverProcessed == nullptr && pindex->nTx == 0) pindexFirstNeverProcessed = pindex;
        if (pindex->pprev != nullptr && pindexFirstNotTreeValid == nullptr && (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_TREE) pindexFirstNotTreeValid = pindex;

        if (pindex->pprev != nullptr) {
            if (pindexFirstNotTransactionsValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_TRANSACTIONS) {
                pindexFirstNotTransactionsValid = pindex;
            }

            if (pindexFirstNotChainValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_CHAIN) {
                pindexFirstNotChainValid = pindex;
            }

            if (pindexFirstNotScriptsValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_SCRIPTS) {
                pindexFirstNotScriptsValid = pindex;
            }
        }

        // Begin: actual consistency checks.
        if (pindex->pprev == nullptr) {
            // Genesis block checks.
            assert(pindex->GetBlockHash() == GetConsensus().hashGenesisBlock); // Genesis block's hash must match.
            for (auto c : GetAll()) {
                if (c->m_chain.Genesis() != nullptr) {
                    assert(pindex == c->m_chain.Genesis()); // The chain's genesis block must be this block.
                }
            }
        }
        if (!pindex->HaveNumChainTxs()) assert(pindex->nSequenceId <= 0); // nSequenceId can't be set positive for blocks that aren't linked (negative is used for preciousblock)
        // VALID_TRANSACTIONS is equivalent to nTx > 0 for all nodes (whether or not pruning has occurred).
        // HAVE_DATA is only equivalent to nTx > 0 (or VALID_TRANSACTIONS) if no pruning has occurred.
        if (!m_blockman.m_have_pruned) {
            // If we've never pruned, then HAVE_DATA should be equivalent to nTx > 0
            assert(!(pindex->nStatus & BLOCK_HAVE_DATA) == (pindex->nTx == 0));
            assert(pindexFirstMissing == pindexFirstNeverProcessed);
        } else {
            // If we have pruned, then we can only say that HAVE_DATA implies nTx > 0
            if (pindex->nStatus & BLOCK_HAVE_DATA) assert(pindex->nTx > 0);
        }
        if (pindex->nStatus & BLOCK_HAVE_UNDO) assert(pindex->nStatus & BLOCK_HAVE_DATA);
        if (snap_base && snap_base->GetAncestor(pindex->nHeight) == pindex) {
            // Assumed-valid blocks should connect to the main chain.
            assert((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE);
        }
        // There should only be an nTx value if we have
        // actually seen a block's transactions.
        assert(((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TRANSACTIONS) == (pindex->nTx > 0)); // This is pruning-independent.
        // All parents having had data (at some point) is equivalent to all parents being VALID_TRANSACTIONS, which is equivalent to HaveNumChainTxs().
        // HaveNumChainTxs will also be set in the assumeutxo snapshot block from snapshot metadata.
        assert((pindexFirstNeverProcessed == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs());
        assert((pindexFirstNotTransactionsValid == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs());
        assert(pindex->nHeight == nHeight); // nHeight must be consistent.
        assert(pindex->pprev == nullptr || pindex->nChainWork >= pindex->pprev->nChainWork); // For every block except the genesis block, the chainwork must be larger than the parent's.
        assert(nHeight < 2 || (pindex->pskip && (pindex->pskip->nHeight < nHeight))); // The pskip pointer must point back for all but the first 2 blocks.
        assert(pindexFirstNotTreeValid == nullptr); // All m_blockman.m_block_index entries must at least be TREE valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE) assert(pindexFirstNotTreeValid == nullptr); // TREE valid implies all parents are TREE valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_CHAIN) assert(pindexFirstNotChainValid == nullptr); // CHAIN valid implies all parents are CHAIN valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_SCRIPTS) assert(pindexFirstNotScriptsValid == nullptr); // SCRIPTS valid implies all parents are SCRIPTS valid
        if (pindexFirstInvalid == nullptr) {
            // Checks for not-invalid blocks.
            assert((pindex->nStatus & BLOCK_FAILED_MASK) == 0); // The failed mask cannot be set for blocks without invalid parents.
        }
        // Make sure m_chain_tx_count sum is correctly computed.
        if (!pindex->pprev) {
            // If no previous block, nTx and m_chain_tx_count must be the same.
            assert(pindex->m_chain_tx_count == pindex->nTx);
        } else if (pindex->pprev->m_chain_tx_count > 0 && pindex->nTx > 0) {
            // If previous m_chain_tx_count is set and number of transactions in block is known, sum must be set.
            assert(pindex->m_chain_tx_count == pindex->nTx + pindex->pprev->m_chain_tx_count);
        } else {
            // Otherwise m_chain_tx_count should only be set if this is a snapshot
            // block, and must be set if it is.
            assert((pindex->m_chain_tx_count != 0) == (pindex == snap_base));
        }

        // Chainstate-specific checks on setBlockIndexCandidates
        for (auto c : GetAll()) {
            if (c->m_chain.Tip() == nullptr) continue;
            // Two main factors determine whether pindex is a candidate in
            // setBlockIndexCandidates:
            //
            // - If pindex has less work than the chain tip, it should not be a
            //   candidate, and this will be asserted below. Otherwise it is a
            //   potential candidate.
            //
            // - If pindex or one of its parent blocks back to the genesis block
            //   or an assumeutxo snapshot never downloaded transactions
            //   (pindexFirstNeverProcessed is non-null), it should not be a
            //   candidate, and this will be asserted below. The only exception
            //   is if pindex itself is an assumeutxo snapshot block. Then it is
            //   also a potential candidate.
            if (!CBlockIndexWorkComparator()(pindex, c->m_chain.Tip()) && (pindexFirstNeverProcessed == nullptr || pindex == snap_base)) {
                // If pindex was detected as invalid (pindexFirstInvalid is
                // non-null), it is not required to be in
                // setBlockIndexCandidates.
                if (pindexFirstInvalid == nullptr) {
                    // If pindex and all its parents back to the genesis block
                    // or an assumeutxo snapshot block downloaded transactions,
                    // and the transactions were not pruned (pindexFirstMissing
                    // is null), it is a potential candidate. The check
                    // excludes pruned blocks, because if any blocks were
                    // pruned between pindex and the current chain tip, pindex will
                    // only temporarily be added to setBlockIndexCandidates,
                    // before being moved to m_blocks_unlinked. This check
                    // could be improved to verify that if all blocks between
                    // the chain tip and pindex have data, pindex must be a
                    // candidate.
                    //
                    // If pindex is the chain tip, it also is a potential
                    // candidate.
                    //
                    // If the chainstate was loaded from a snapshot and pindex
                    // is the base of the snapshot, pindex is also a potential
                    // candidate.
                    if (pindexFirstMissing == nullptr || pindex == c->m_chain.Tip() || pindex == c->SnapshotBase()) {
                        // If this chainstate is the active chainstate, pindex
                        // must be in setBlockIndexCandidates. Otherwise, this
                        // chainstate is a background validation chainstate, and
                        // pindex only needs to be added if it is an ancestor of
                        // the snapshot that is being validated.
                        if (c == &ActiveChainstate() || snap_base->GetAncestor(pindex->nHeight) == pindex) {
                            assert(c->setBlockIndexCandidates.count(pindex));
                        }
                    }
                    // If some parent is missing, then it could be that this block was in
                    // setBlockIndexCandidates but had to be removed because of the missing data.
                    // In this case it must be in m_blocks_unlinked -- see test below.
                }
            } else { // If this block sorts worse than the current tip or some ancestor's block has never been seen, it cannot be in setBlockIndexCandidates.
                assert(c->setBlockIndexCandidates.count(pindex) == 0);
            }
        }
        // Check whether this block is in m_blocks_unlinked.
        std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> rangeUnlinked = m_blockman.m_blocks_unlinked.equal_range(pindex->pprev);
        bool foundInUnlinked = false;
        while (rangeUnlinked.first != rangeUnlinked.second) {
            assert(rangeUnlinked.first->first == pindex->pprev);
            if (rangeUnlinked.first->second == pindex) {
                foundInUnlinked = true;
                break;
            }
            rangeUnlinked.first++;
        }
        if (pindex->pprev && (pindex->nStatus & BLOCK_HAVE_DATA) && pindexFirstNeverProcessed != nullptr && pindexFirstInvalid == nullptr) {
            // If this block has block data available, some parent was never received, and has no invalid parents, it must be in m_blocks_unlinked.
            assert(foundInUnlinked);
        }
        if (!(pindex->nStatus & BLOCK_HAVE_DATA)) assert(!foundInUnlinked); // Can't be in m_blocks_unlinked if we don't HAVE_DATA
        if (pindexFirstMissing == nullptr) assert(!foundInUnlinked); // We aren't missing data for any parent -- cannot be in m_blocks_unlinked.
        if (pindex->pprev && (pindex->nStatus & BLOCK_HAVE_DATA) && pindexFirstNeverProcessed == nullptr && pindexFirstMissing != nullptr) {
            // We HAVE_DATA for this block, have received data for all parents at some point, but we're currently missing data for some parent.
            assert(m_blockman.m_have_pruned);
            // This block may have entered m_blocks_unlinked if:
            //  - it has a descendant that at some point had more work than the
            //    tip, and
            //  - we tried switching to that descendant but were missing
            //    data for some intermediate block between m_chain and the
            //    tip.
            // So if this block is itself better than any m_chain.Tip() and it wasn't in
            // setBlockIndexCandidates, then it must be in m_blocks_unlinked.
            for (auto c : GetAll()) {
                const bool is_active = c == &ActiveChainstate();
                if (!CBlockIndexWorkComparator()(pindex, c->m_chain.Tip()) && c->setBlockIndexCandidates.count(pindex) == 0) {
                    if (pindexFirstInvalid == nullptr) {
                        if (is_active || snap_base->GetAncestor(pindex->nHeight) == pindex) {
                            assert(foundInUnlinked);
                        }
                    }
                }
            }
        }
        // assert(pindex->GetBlockHash() == pindex->GetBlockHeader().GetHash()); // Perhaps too slow
        // End: actual consistency checks.


        // Try descending into the first subnode. Always process forks first and the best header chain after.
        snap_update_firsts();
        std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> range = forward.equal_range(pindex);
        if (range.first != range.second) {
            // A subnode not part of the best header chain was found.
            pindex = range.first->second;
            nHeight++;
            continue;
        } else if (best_hdr_chain.Contains(pindex)) {
            // Descend further into best header chain.
            nHeight++;
            pindex = best_hdr_chain[nHeight];
            if (!pindex) break; // we are finished, since the best header chain is always processed last
            continue;
        }
        // This is a leaf node.
        // Move upwards until we reach a node of which we have not yet visited the last child.
        while (pindex) {
            // We are going to either move to a parent or a sibling of pindex.
            snap_update_firsts();
            // If pindex was the first with a certain property, unset the corresponding variable.
            if (pindex == pindexFirstInvalid) pindexFirstInvalid = nullptr;
            if (pindex == pindexFirstMissing) pindexFirstMissing = nullptr;
            if (pindex == pindexFirstNeverProcessed) pindexFirstNeverProcessed = nullptr;
            if (pindex == pindexFirstNotTreeValid) pindexFirstNotTreeValid = nullptr;
            if (pindex == pindexFirstNotTransactionsValid) pindexFirstNotTransactionsValid = nullptr;
            if (pindex == pindexFirstNotChainValid) pindexFirstNotChainValid = nullptr;
            if (pindex == pindexFirstNotScriptsValid) pindexFirstNotScriptsValid = nullptr;
            // Find our parent.
            CBlockIndex* pindexPar = pindex->pprev;
            // Find which child we just visited.
            std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> rangePar = forward.equal_range(pindexPar);
            while (rangePar.first->second != pindex) {
                assert(rangePar.first != rangePar.second); // Our parent must have at least the node we're coming from as child.
                rangePar.first++;
            }
            // Proceed to the next one.
            rangePar.first++;
            if (rangePar.first != rangePar.second) {
                // Move to a sibling not part of the best header chain.
                pindex = rangePar.first->second;
                break;
            } else if (pindexPar == best_hdr_chain[nHeight - 1]) {
                // Move to pindex's sibling on the best-chain, if it has one.
                pindex = best_hdr_chain[nHeight];
                // There will not be a next block if (and only if) parent block is the best header.
                assert((pindex == nullptr) == (pindexPar == best_hdr_chain.Tip()));
                break;
            } else {
                // Move up further.
                pindex = pindexPar;
                nHeight--;
                continue;
            }
        }
    }

    // Check that we actually traversed the entire block index.
    assert(nNodes == forward.size() + best_hdr_chain.Height() + 1);
}